

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl> *this,
          void *pointer)

{
  if (pointer != (void *)0x0) {
    if (*(char *)((long)pointer + 0x70) == '\x01') {
      kj::anon_unknown_0::NetworkAddressImpl::~NetworkAddressImpl
                ((NetworkAddressImpl *)((long)pointer + 0x100));
    }
    ArrayBuilder<kj::AncillaryMessage>::dispose
              ((ArrayBuilder<kj::AncillaryMessage> *)((long)pointer + 0x40));
    Array<unsigned_char>::~Array((Array<unsigned_char> *)((long)pointer + 0x28));
    Array<unsigned_char>::~Array((Array<unsigned_char> *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x138);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }